

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_array_view.hpp
# Opt level: O2

span<const_unsigned_short,_18446744073709551615UL> __thiscall
jsoncons::typed_array_view::data(typed_array_view *this)

{
  assertion_error *this_00;
  span<const_unsigned_short,_18446744073709551615UL> sVar1;
  allocator<char> local_31;
  string local_30;
  
  if (this->type_ == half_value) {
    sVar1.data_ = *(pointer *)&this->data_;
    sVar1.size_ = this->size_;
    return sVar1;
  }
  this_00 = (assertion_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "assertion \'type_ == typed_array_type::half_value\' failed at  <> :0",&local_31);
  assertion_error::assertion_error(this_00,&local_30);
  __cxa_throw(this_00,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

jsoncons::span<const uint16_t> data(half_array_arg_t) const
        {
            JSONCONS_ASSERT(type_ == typed_array_type::half_value);
            return jsoncons::span<const uint16_t>(data_.uint16_data_, size_);
        }